

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

bool __thiscall Env::insertfunc(Env *this,string *s,attr *a)

{
  anon_union_8_4_35def4f3_for_attr_1 aVar1;
  undefined4 uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  _Rb_tree_header *p_Var5;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
          ::find(&(this->func_table)._M_t,s);
  p_Var5 = &(this->func_table)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var5) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
             ::operator[](&this->func_table,s);
    uVar2 = *(undefined4 *)&a->field_0x4;
    aVar1 = a->field_1;
    pmVar4->kind = a->kind;
    *(undefined4 *)&pmVar4->field_0x4 = uVar2;
    pmVar4->field_1 = aVar1;
  }
  return (_Rb_tree_header *)iVar3._M_node == p_Var5;
}

Assistant:

bool Env::insertfunc(const string &s, const struct attr &a) {
    if (func_table.find(s) != func_table.end())
        return false;
    func_table[s] = a;
    return true;
}